

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfunction.h
# Opt level: O2

void __thiscall
TPZFunction<std::complex<double>_>::Print(TPZFunction<std::complex<double>_> *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<(out,
                           "virtual void TPZFunction<std::complex<double>>::Print(std::ostream &) [T = std::complex<double>]"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"Polynomial Order = ");
  iVar1 = (**(code **)((long)*this + 0x68))(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

virtual void Print(std::ostream &out)
    {
        out << __PRETTY_FUNCTION__ << std::endl;
        out << "Polynomial Order = " << PolynomialOrder() << std::endl;
    }